

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  level_details *plVar6;
  endpoint_indices_details *peVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  uint16 i;
  ushort *puVar24;
  uint uVar25;
  ulong uVar26;
  vector<unsigned_short> *pvVar27;
  int iVar28;
  ulong uVar29;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  elemental_vector local_188;
  vector<unsigned_short> *local_178;
  ulong local_170;
  void *local_168;
  undefined8 uStack_160;
  uchar *local_150;
  uint local_148;
  long local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  symbol_codec local_f8;
  crn_comp *local_60;
  void *local_58;
  unsigned_short *local_50;
  ulong local_48;
  ushort *local_40;
  long local_38;
  
  pvVar27 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar20 = (ulong)uVar5;
  uVar9 = pvVar27->m_size;
  uVar19 = (uint)uVar5;
  uVar23 = (uint)uVar5;
  uVar17 = (uint)uVar5;
  local_178 = pvVar27;
  if (uVar9 != uVar5) {
    if (uVar9 <= uVar5) {
      if (pvVar27->m_capacity < uVar23) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar27,uVar17,uVar9 + 1 == uVar23,2,(object_mover)0x0,false)
        ;
      }
      memset(pvVar27->m_p + pvVar27->m_size,0,(ulong)(uVar17 - pvVar27->m_size) * 2);
    }
    local_178->m_size = uVar19;
  }
  pvVar27 = local_178;
  if (data == 0) {
    lVar1 = *pData_ptr;
    uVar9 = local_178->m_size;
    if (uVar9 != uVar23) {
      if (uVar9 < uVar19 || uVar9 == uVar23) {
        if (local_178->m_capacity < uVar23) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_178,uVar23,uVar9 + 1 == uVar23,2,(object_mover)0x0,
                     false);
        }
        memset(pvVar27->m_p + pvVar27->m_size,0,(ulong)(uVar19 - pvVar27->m_size) * 2);
      }
      pvVar27->m_size = uVar19;
    }
    local_f8.m_pDecode_buf = (uint8 *)0x0;
    local_f8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar20 == 0) {
      local_168 = (void *)0x0;
      uStack_160 = (unsigned_short *)0x0;
    }
    else {
      uVar9 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_f8,uVar9,uVar9 == 1,2,(object_mover)0x0,false);
      uVar17 = (uint)uVar5;
      local_f8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_f8.m_pDecode_buf_next._4_4_,uVar17);
      local_168 = (void *)0x0;
      uStack_160 = (unsigned_short *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_168,uVar17,uVar9 == 1,2,(object_mover)0x0,false);
      memset((void *)(((ulong)uStack_160 & 0xffffffff) * 2 + (long)local_168),0,
             (ulong)(uVar17 - (uint)uStack_160) * 2);
      uStack_160 = (unsigned_short *)CONCAT44(uStack_160._4_4_,uVar17);
      uVar26 = 0;
      do {
        *(ushort *)((long)local_f8.m_pDecode_buf + uVar26 * 2) = *(ushort *)(lVar1 + uVar26 * 2);
        *(short *)((long)local_168 + uVar26 * 2) = (short)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar20 != uVar26);
      bVar14 = 0;
      bVar22 = 0;
      uVar26 = uVar20;
      do {
        uVar17 = 0xffffffff;
        uVar11 = 0;
        uVar9 = 0;
        do {
          iVar16 = (uint)(byte)*(ushort *)((long)local_f8.m_pDecode_buf + uVar11 * 2) - (uint)bVar14
          ;
          iVar28 = (uint)*(byte *)((long)local_f8.m_pDecode_buf + uVar11 * 2 + 1) - (uint)bVar22;
          uVar23 = iVar28 * iVar28 + iVar16 * iVar16;
          if (uVar23 < uVar17) {
            uVar17 = uVar23;
            uVar9 = (uint)uVar11;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar26);
        uVar11 = (ulong)((uVar9 & 0xffff) * 2);
        bVar14 = *(byte *)((long)local_f8.m_pDecode_buf + uVar11);
        bVar22 = *(byte *)((long)local_f8.m_pDecode_buf + uVar11 + 1);
        local_178->m_p[*(ushort *)((long)local_168 + uVar11)] = uVar5 - (short)uVar26;
        *(ushort *)((long)local_f8.m_pDecode_buf + uVar11) =
             *(ushort *)((long)local_f8.m_pDecode_buf + (uVar26 - 1) * 2);
        *(undefined2 *)((long)local_168 + uVar11) =
             *(undefined2 *)((long)local_168 + uVar26 * 2 + -2);
        uVar26 = uVar26 - 1;
        pvVar27 = local_178;
      } while (uVar26 != 0);
    }
    if (local_168 != (void *)0x0) {
      crnlib_free(local_168);
    }
    if ((ushort *)local_f8.m_pDecode_buf != (ushort *)0x0) {
      crnlib_free(local_f8.m_pDecode_buf);
    }
    optimize_alpha_selectors(this);
  }
  else {
    local_50 = local_178->m_p;
    local_100 = *pData_ptr;
    local_128 = *(long *)((long)pData_ptr + 8);
    uVar5 = *(ushort *)((long)pData_ptr + 0x12);
    local_170 = CONCAT44(local_170._4_4_,*(undefined4 *)((long)pData_ptr + 0x14));
    local_f8.m_pDecode_buf = (uint8 *)0x0;
    local_f8.m_pDecode_buf_next = (uint8 *)0x0;
    local_168 = (void *)0x0;
    uStack_160 = (unsigned_short *)0x0;
    local_188.m_p = (void *)0x0;
    local_188.m_size = 0;
    local_188.m_capacity = 0;
    if (uVar23 != 0) {
      elemental_vector::increase_capacity(&local_188,uVar23,uVar23 == 1,4,(object_mover)0x0,false);
      memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
             (ulong)(uVar23 - local_188.m_size) << 2);
      local_188.m_size = uVar23;
    }
    local_60 = this;
    local_58 = pData_ptr;
    if (local_f8.m_pDecode_buf_next._4_4_ <= (uint)local_f8.m_pDecode_buf_next) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_f8,(uint)local_f8.m_pDecode_buf_next + 1,true,2,
                 (object_mover)0x0,false);
    }
    *(ushort *)
     ((long)local_f8.m_pDecode_buf + ((ulong)local_f8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_f8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_f8.m_pDecode_buf_next._4_4_,(uint)local_f8.m_pDecode_buf_next + 1);
    if (uVar20 != 0) {
      lVar1 = local_128 + (ulong)(uVar5 * uVar17) * 4;
      uVar26 = 0;
      do {
        if (uVar5 != uVar26) {
          if (uStack_160._4_4_ <= (uint)uStack_160) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_168,(uint)uStack_160 + 1,true,2,(object_mover)0x0,
                       false);
          }
          *(short *)((long)local_168 + ((ulong)uStack_160 & 0xffffffff) * 2) = (short)uVar26;
          uStack_160 = (unsigned_short *)CONCAT44(uStack_160._4_4_,(uint)uStack_160 + 1);
          *(undefined4 *)((long)local_188.m_p + uVar26 * 4) = *(undefined4 *)(lVar1 + uVar26 * 4);
        }
        uVar26 = uVar26 + 1;
      } while (uVar20 != uVar26);
    }
    if ((uint)uStack_160 != 0) {
      local_38 = (long)((float)local_170 * 1000.0 + 1000.0);
      local_170 = 0;
      local_48 = uVar20;
      do {
        uVar20 = local_48;
        uVar26 = (ulong)local_f8.m_pDecode_buf_next & 0xffffffff;
        uVar15 = (ulong)((uint)local_f8.m_pDecode_buf_next - 1);
        local_40 = (ushort *)local_f8.m_pDecode_buf;
        local_108 = 0;
        uVar11 = 0;
        uVar12 = 0;
        local_110 = 0;
        local_118 = 0;
        do {
          uVar21 = (ulong)*(ushort *)((long)local_168 + (uVar12 & 0xffff) * 2);
          bVar14 = *(byte *)(local_100 + uVar21 * 2);
          iVar28 = (uint)bVar14 -
                   (uint)*(byte *)(local_100 + (ulong)*(ushort *)local_f8.m_pDecode_buf * 2);
          uVar9 = (uint)*(byte *)(local_100 + 1 + uVar21 * 2);
          iVar16 = uVar9 - *(byte *)(local_100 + 1 + (ulong)*(ushort *)local_f8.m_pDecode_buf * 2);
          uVar17 = iVar16 * iVar16 + iVar28 * iVar28;
          if (999 < uVar17) {
            uVar17 = 1000;
          }
          iVar28 = (uint)bVar14 -
                   (uint)*(byte *)(local_100 +
                                  (ulong)*(ushort *)((long)local_f8.m_pDecode_buf + uVar15 * 2) * 2)
          ;
          iVar16 = uVar9 - *(byte *)(local_100 + 1 +
                                    (ulong)*(ushort *)((long)local_f8.m_pDecode_buf + uVar15 * 2) *
                                    2);
          uVar9 = iVar16 * iVar16 + iVar28 * iVar28;
          if (999 < uVar9) {
            uVar9 = 1000;
          }
          uVar29 = (ulong)((int)local_38 - uVar17);
          uVar18 = (ulong)((int)local_38 - uVar9);
          uVar10 = uVar18;
          if (uVar18 < uVar29) {
            uVar10 = uVar29;
          }
          uVar10 = (uint)(*(int *)((long)local_188.m_p + uVar21 * 4) + (int)(float)local_170) *
                   uVar10;
          if (uVar11 <= uVar10) {
            uVar11 = uVar10 + 1;
            local_118 = uVar29;
            local_110 = uVar18;
            local_108 = uVar12;
          }
          uVar9 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar9;
        } while ((uVar9 & 0xffff) < (uint)uStack_160);
        uVar8 = (ushort)local_108;
        uVar11 = local_108 & 0xffff;
        uVar5 = *(ushort *)((long)local_168 + uVar11 * 2);
        lVar1 = local_128 + (ulong)((uint)uVar5 * (int)local_48) * 4;
        if ((int)((uint)local_f8.m_pDecode_buf_next - 1) < 1) {
          uVar12 = 0;
          uVar15 = 0;
        }
        else {
          iVar16 = (uint)local_f8.m_pDecode_buf_next + 1;
          uVar9 = 0;
          uVar12 = 0;
          puVar24 = (ushort *)local_f8.m_pDecode_buf;
          do {
            iVar16 = iVar16 + -2;
            uVar12 = (ulong)(uint)((int)uVar12 + *(int *)(lVar1 + (ulong)*puVar24 * 4) * iVar16);
            uVar9 = uVar9 + *(int *)(lVar1 + (ulong)*(ushort *)
                                                     ((long)local_f8.m_pDecode_buf + uVar15 * 2) * 4
                                    ) * iVar16;
            uVar15 = (ulong)((int)uVar15 - 1);
            puVar24 = puVar24 + 1;
          } while (2 < iVar16);
          uVar15 = (ulong)uVar9;
        }
        local_170 = (ulong)*(uint *)((long)local_188.m_p + (ulong)uVar5 * 4);
        local_120 = uVar26;
        if (uVar12 * local_118 < uVar15 * local_110 || uVar12 * local_118 - uVar15 * local_110 == 0)
        {
          if (local_f8.m_pDecode_buf_next._4_4_ <= (uint)local_f8.m_pDecode_buf_next) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_f8,(uint)local_f8.m_pDecode_buf_next + 1,true,2,
                       (object_mover)0x0,false);
          }
          *(ushort *)
           ((long)local_f8.m_pDecode_buf + ((ulong)local_f8.m_pDecode_buf_next & 0xffffffff) * 2) =
               uVar5;
          local_f8.m_pDecode_buf_next =
               (uint8 *)CONCAT44(local_f8.m_pDecode_buf_next._4_4_,
                                 (uint)local_f8.m_pDecode_buf_next + 1);
        }
        else {
          uVar9 = (uint)local_f8.m_pDecode_buf_next + 1;
          if (uVar26 != 0xffffffff) {
            if (local_f8.m_pDecode_buf_next._4_4_ < uVar9) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_f8,uVar9,true,2,(object_mover)0x0,false);
            }
            memset((ushort *)
                   ((long)local_f8.m_pDecode_buf +
                   ((ulong)local_f8.m_pDecode_buf_next & 0xffffffff) * 2),0,
                   (ulong)(uVar9 - (uint)local_f8.m_pDecode_buf_next) * 2);
          }
          local_f8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_f8.m_pDecode_buf_next._4_4_,uVar9);
          memmove((ushort *)((long)local_f8.m_pDecode_buf + 2),local_f8.m_pDecode_buf,uVar26 * 2);
          *(ushort *)local_f8.m_pDecode_buf = uVar5;
        }
        if (uVar8 < (uint)uStack_160) {
          memmove((void *)((long)local_168 + uVar11 * 2),(void *)((long)local_168 + uVar11 * 2 + 2),
                  (ulong)((uint)uStack_160 + ~(uint)uVar8) * 2);
          uStack_160 = (unsigned_short *)CONCAT44(uStack_160._4_4_,(uint)uStack_160 - 1);
        }
        if ((uint)uStack_160 != 0) {
          uVar9 = 1;
          do {
            lVar13 = (ulong)*(ushort *)((long)local_168 + (ulong)(uVar9 - 1 & 0xffff) * 2) * 4;
            piVar2 = (int *)((long)local_188.m_p + lVar13);
            *piVar2 = *piVar2 + *(int *)(lVar1 + lVar13);
            uVar17 = uVar9 & 0xffff;
            uVar9 = uVar9 + 1;
          } while (uVar17 < (uint)uStack_160);
        }
      } while ((uint)uStack_160 != 0);
    }
    pData_ptr = local_58;
    this = local_60;
    pvVar27 = local_178;
    if (uVar20 != 0) {
      uVar26 = 0;
      do {
        local_50[*(ushort *)((long)local_f8.m_pDecode_buf + uVar26 * 2)] = (unsigned_short)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar20 != uVar26);
    }
    if (local_188.m_p != (void *)0x0) {
      crnlib_free(local_188.m_p);
    }
    if (local_168 != (void *)0x0) {
      crnlib_free(local_168);
    }
    if ((ushort *)local_f8.m_pDecode_buf != (ushort *)0x0) {
      crnlib_free(local_f8.m_pDecode_buf);
    }
  }
  pack_alpha_endpoints
            (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),pvVar27);
  iVar16 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  uVar9 = (uint)uVar20;
  if (uVar20 != 0) {
    elemental_vector::increase_capacity(&local_188,uVar9,uVar9 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(uVar9 - local_188.m_size) << 2);
    local_188.m_size = uVar9;
    pvVar27 = local_178;
  }
  if ((this->m_levels).m_size != 0) {
    bVar3 = this->m_has_comp[1];
    bVar4 = this->m_has_comp[2];
    uVar26 = 0;
    do {
      plVar6 = (this->m_levels).m_p;
      uVar17 = plVar6[uVar26].first_block;
      uVar11 = (ulong)uVar17;
      uVar23 = plVar6[uVar26].num_blocks + uVar17;
      if (uVar17 < uVar23) {
        uVar17 = 0;
        uVar19 = 0;
        do {
          uVar25 = uVar17;
          if ((bVar3 != false) &&
             (peVar7 = (this->m_endpoint_indices).m_p,
             uVar25 = (uint)pvVar27->m_p[peVar7[uVar11].field_0.field_0.alpha0],
             peVar7[uVar11].reference == '\0')) {
            piVar2 = (int *)((long)local_188.m_p +
                            (ulong)(((int)(uVar25 - uVar17) >> 0x1f & uVar9) + (uVar25 - uVar17)) *
                            4);
            *piVar2 = *piVar2 + 1;
          }
          uVar17 = uVar25;
          uVar25 = uVar19;
          if (bVar4 != false) {
            peVar7 = (this->m_endpoint_indices).m_p;
            uVar5 = pvVar27->m_p[peVar7[uVar11].field_0.field_0.alpha1];
            uVar25 = (uint)uVar5;
            if (peVar7[uVar11].reference == '\0') {
              piVar2 = (int *)((long)local_188.m_p +
                              (ulong)(((int)(uVar5 - uVar19) >> 0x1f & uVar9) + (uVar5 - uVar19)) *
                              4);
              *piVar2 = *piVar2 + 1;
            }
          }
          uVar19 = uVar25;
          uVar11 = uVar11 + 1;
        } while (uVar23 != uVar11);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (this->m_levels).m_size);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_168);
  static_huffman_data_model::init((static_huffman_data_model *)&local_168,(EVP_PKEY_CTX *)0x1);
  if (local_148 == 0) {
    local_150 = (uchar *)0x0;
  }
  iVar16 = iVar16 << 3;
  if (uVar20 != 0) {
    uVar26 = 0;
    do {
      iVar16 = iVar16 + (uint)local_150[uVar26] * *(int *)((long)local_188.m_p + uVar26 * 4);
      uVar26 = uVar26 + 1;
    } while ((uVar20 & 0xffffffff) != uVar26);
  }
  symbol_codec::symbol_codec(&local_f8);
  symbol_codec::start_encoding(&local_f8,0x10000);
  local_f8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_f8,(static_huffman_data_model *)&local_168,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_f8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar16 + local_f8.m_total_bits_written;
  if (pData_ptr != (void *)0x0) {
    crnlib_free(pData_ptr);
  }
  if (local_f8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_f8.m_output_syms.m_p);
  }
  if (local_f8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_f8.m_arith_output_buf.m_p);
  }
  if (local_f8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_f8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_168);
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_alpha_selectors();
  }

  pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      if (hasAlpha0) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha0_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha0_index = index;
      }
      if (hasAlpha1) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha1_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha1_index = index;
      }
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}